

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

int pcp_eval_flow_state(pcp_flow_t *flow,pcp_fstate_e *fstate)

{
  pcp_flow_state_e pVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int ffailed;
  int fsuccess;
  int fpresent_no_exit_state;
  int nexit_states;
  pcp_flow_t *fiter;
  pcp_fstate_e *fstate_local;
  pcp_flow_t *flow_local;
  
  fsuccess = 0;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  for (_fpresent_no_exit_state = flow; _fpresent_no_exit_state != (pcp_flow_t *)0x0;
      _fpresent_no_exit_state = _fpresent_no_exit_state->next_child) {
    pVar1 = _fpresent_no_exit_state->state;
    if (pVar1 == pfs_wait_after_short_life_error) {
      fsuccess = fsuccess + 1;
    }
    else if (pVar1 == pfs_wait_for_lifetime_renew) {
      bVar3 = true;
      fsuccess = fsuccess + 1;
    }
    else if (pVar1 == pfs_failed) {
      bVar4 = true;
      fsuccess = fsuccess + 1;
    }
    else {
      bVar2 = true;
    }
  }
  if (fstate != (pcp_fstate_e *)0x0) {
    if (bVar2) {
      if (bVar3) {
        *fstate = pcp_state_partial_result;
      }
      else {
        *fstate = pcp_state_processing;
      }
    }
    else if (bVar3) {
      *fstate = pcp_state_succeeded;
    }
    else if (bVar4) {
      *fstate = pcp_state_failed;
    }
    else {
      *fstate = pcp_state_short_lifetime_error;
    }
  }
  return fsuccess;
}

Assistant:

int pcp_eval_flow_state(pcp_flow_t *flow, pcp_fstate_e *fstate) {
    pcp_flow_t *fiter;
    int nexit_states = 0;
    int fpresent_no_exit_state = 0;
    int fsuccess = 0;
    int ffailed = 0;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    for (fiter = flow; fiter != NULL; fiter = fiter->next_child) {
        switch (fiter->state) {
        case pfs_wait_for_lifetime_renew:
            fsuccess = 1;
            ++nexit_states;
            break;
        case pfs_failed:
            ffailed = 1;
            ++nexit_states;
            break;
        case pfs_wait_after_short_life_error:
            ++nexit_states;
            break;
        default:
            fpresent_no_exit_state = 1;
            break;
        }
    }

    if (fstate) {
        if (fpresent_no_exit_state) {
            if (fsuccess) {
                *fstate = pcp_state_partial_result;
            } else {
                *fstate = pcp_state_processing;
            }
        } else {
            if (fsuccess) {
                *fstate = pcp_state_succeeded;
            } else if (ffailed) {
                *fstate = pcp_state_failed;
            } else {
                *fstate = pcp_state_short_lifetime_error;
            }
        }
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return nexit_states;
}